

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quaternion_motion_blur_device.cpp
# Opt level: O0

void embree::renderPixelStandard
               (TutorialData *data,int x,int y,int *pixels,uint width,uint height,float time,
               ISPCCamera *camera,RayStats *stats)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  float fVar4;
  undefined1 auVar5 [16];
  uint b;
  uint g;
  uint r;
  float f;
  Vec3ff accu_color;
  Vec3fa color;
  __m128 r_1;
  __m128 a;
  float local_2b8;
  float local_2b4;
  float local_2b0;
  float local_2ac;
  float local_2a8;
  float local_2a4;
  float local_2a0;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  ISPCCamera *in_stack_fffffffffffffd98;
  float in_stack_fffffffffffffda0;
  float in_stack_fffffffffffffda4;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  float local_248;
  float local_244;
  float local_240;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_48;
  
  renderPixelStandard((TutorialData *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                      in_stack_fffffffffffffda4,in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                      (RayStats *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  puVar3 = (undefined8 *)(*(long *)(in_RDI + 0x30) + (ulong)(uint)(in_EDX * in_R8D + in_ESI) * 0x10)
  ;
  uVar1 = *puVar3;
  uVar2 = puVar3[1];
  local_f8 = (float)uVar1;
  fStack_f4 = (float)((ulong)uVar1 >> 0x20);
  fStack_f0 = (float)uVar2;
  fStack_ec = (float)((ulong)uVar2 >> 0x20);
  local_2a0 = fStack_ec + 1.0;
  puVar3 = (undefined8 *)(*(long *)(in_RDI + 0x30) + (ulong)(uint)(in_EDX * in_R8D + in_ESI) * 0x10)
  ;
  *puVar3 = CONCAT44(fStack_f4 + local_244,local_f8 + local_248);
  puVar3[1] = CONCAT44(local_2a0,fStack_f0 + local_240);
  if (local_2a0 <= 1.0) {
    local_2a0 = 1.0;
  }
  auVar5 = rcpss(ZEXT416((uint)local_2a0),ZEXT416((uint)local_2a0));
  local_48 = auVar5._0_4_;
  local_48 = local_48 * (2.0 - local_48 * local_2a0);
  fVar4 = (local_f8 + local_248) * local_48;
  local_2a4 = 1.0;
  if (fVar4 < 1.0) {
    local_2a4 = fVar4;
  }
  local_2a8 = 0.0;
  if (0.0 <= local_2a4) {
    local_2a8 = local_2a4;
  }
  fVar4 = (fStack_f4 + local_244) * local_48;
  local_2ac = 1.0;
  if (fVar4 < 1.0) {
    local_2ac = fVar4;
  }
  local_2b0 = 0.0;
  if (0.0 <= local_2ac) {
    local_2b0 = local_2ac;
  }
  local_48 = (fStack_f0 + local_240) * local_48;
  local_2b4 = 1.0;
  if (local_48 < 1.0) {
    local_2b4 = local_48;
  }
  local_2b8 = 0.0;
  if (0.0 <= local_2b4) {
    local_2b8 = local_2b4;
  }
  *(int *)(in_RCX + (ulong)(uint)(in_EDX * in_R8D + in_ESI) * 4) =
       (int)(long)(local_2b8 * 255.0) * 0x10000 + (int)(long)(local_2b0 * 255.0) * 0x100 +
       (int)(long)(local_2a8 * 255.0);
  return;
}

Assistant:

void renderPixelStandard(const TutorialData& data,
                         int x, int y,
                         int* pixels,
                         const unsigned int width,
                         const unsigned int height,
                         const float time,
                         const ISPCCamera& camera, RayStats& stats)
{
  Vec3fa color = renderPixelStandard(data,(float)x,(float)y,camera,stats);

  /* write color to framebuffer */
  Vec3ff accu_color = data.g_accu[y*width+x] + Vec3ff(color.x,color.y,color.z,1.0f); data.g_accu[y*width+x] = accu_color;
  float f = rcp(max(1.f,accu_color.w));
  unsigned int r = (unsigned int) (255.0f * clamp(accu_color.x*f,0.0f,1.0f));
  unsigned int g = (unsigned int) (255.0f * clamp(accu_color.y*f,0.0f,1.0f));
  unsigned int b = (unsigned int) (255.0f * clamp(accu_color.z*f,0.0f,1.0f));
  pixels[y*width+x] = (b << 16) + (g << 8) + r;
}